

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void readDFA(string *fileName,adjacencyType *adjVec,int *numOfStates,
            vector<edge,_std::allocator<edge>_> *newEdges)

{
  size_type sVar1;
  undefined4 *in_RDX;
  vector<edge,_std::allocator<edge>_> *in_stack_00000020;
  string *in_stack_00000028;
  uint in_stack_00000034;
  adjacencyType *in_stack_00000038;
  ifstream *in_stack_00000040;
  string curString;
  ifstream fileStream;
  pointer in_stack_fffffffffffffd70;
  pointer in_stack_fffffffffffffd80;
  regex *in_stack_fffffffffffffd90;
  ifstream *in_stack_fffffffffffffd98;
  flag_type in_stack_fffffffffffffda4;
  string *in_stack_fffffffffffffda8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffdb0;
  string local_248 [32];
  istream local_228 [383];
  char in_stack_ffffffffffffff57;
  string *in_stack_ffffffffffffff58;
  
  anon_unknown.dwarf_29c37::openFile(in_stack_fffffffffffffda8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
  anon_unknown.dwarf_29c37::skipUntilRegex(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffd70);
  anon_unknown.dwarf_29c37::split(in_stack_ffffffffffffff58,in_stack_ffffffffffffff57);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xfffffffffffffd70);
  *in_RDX = (int)sVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd80);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_248);
  anon_unknown.dwarf_29c37::readEdges
            (in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000028,
             in_stack_00000020);
  std::__cxx11::string::~string(local_248);
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void readDFA(const string & fileName,
             adjacencyType & adjVec,
             int & numOfStates,
             vector<edge> & newEdges)
{
    ifstream fileStream = openFile(fileName);

    // get number of states
    string curString = skipUntilRegex(fileStream, regex("[0-9]+"));
    numOfStates = static_cast<int>(split(curString, ';').size());
    getline(fileStream, curString);

    readEdges(fileStream, adjVec, static_cast<unsigned int>(numOfStates), curString, newEdges);
}